

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

void fblock(sunrealtype t,sunrealtype *cdata,int jx,int jy,sunrealtype *cdotdata,WebData wdata)

{
  sunrealtype *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  WebData in_R8;
  sunrealtype in_XMM0_Qa;
  sunrealtype y;
  sunrealtype x;
  int ic;
  int iblok;
  
  WebRates((double)in_ESI * in_R8->dx,(double)in_EDX * in_R8->dy,in_XMM0_Qa,
           (sunrealtype *)(in_RDI + (long)(in_R8->ns * (in_ESI + in_EDX * in_R8->mx)) * 8),in_RCX,
           in_R8);
  return;
}

Assistant:

static void fblock(sunrealtype t, sunrealtype cdata[], int jx, int jy,
                   sunrealtype cdotdata[], WebData wdata)
{
  int iblok, ic;
  sunrealtype x, y;

  iblok = jx + jy * (wdata->mx);
  y     = jy * (wdata->dy);
  x     = jx * (wdata->dx);
  ic    = (wdata->ns) * (iblok);
  WebRates(x, y, t, cdata + ic, cdotdata, wdata);
}